

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  MultiFileErrorCollector *pMVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SingleFileErrorCollector file_error_collector;
  Parser parser;
  Tokenizer tokenizer;
  ZeroCopyInputStream *input;
  
  iVar3 = (*this->source_tree_->_vptr_SourceTree[2])();
  input = (ZeroCopyInputStream *)CONCAT44(extraout_var,iVar3);
  if (input == (ZeroCopyInputStream *)0x0) {
    pMVar1 = this->error_collector_;
    if (pMVar1 != (MultiFileErrorCollector *)0x0) {
      (*this->source_tree_->_vptr_SourceTree[3])(&tokenizer);
      (*pMVar1->_vptr_MultiFileErrorCollector[2])(pMVar1,filename,0xffffffffffffffff,0,&tokenizer);
      std::__cxx11::string::~string((string *)&tokenizer);
    }
    bVar2 = false;
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector
              (&file_error_collector,filename,this->error_collector_);
    io::Tokenizer::Tokenizer(&tokenizer,input,&file_error_collector.super_ErrorCollector);
    Parser::Parser(&parser);
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      parser.error_collector_ = &file_error_collector.super_ErrorCollector;
    }
    if (this->using_validation_error_collector_ == true) {
      parser.source_location_table_ = &this->source_locations_;
    }
    FileDescriptorProto::set_name(output,filename);
    bVar2 = Parser::Parse(&parser,&tokenizer,output);
    bVar2 = (bool)(bVar2 & (file_error_collector.had_errors_ ^ 1U));
    Parser::~Parser(&parser);
    io::Tokenizer::~Tokenizer(&tokenizer);
    SingleFileErrorCollector::~SingleFileErrorCollector(&file_error_collector);
    (*input->_vptr_ZeroCopyInputStream[1])(input);
  }
  return bVar2;
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(
    const string& filename, FileDescriptorProto* output) {
  google::protobuf::scoped_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) &&
         !file_error_collector.had_errors();
}